

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O1

err_t MemWrite(memstream *p,void *Data,size_t Size,size_t *Written)

{
  err_t eVar1;
  
  *Written = 0;
  eVar1 = -4;
  if (Size + p->Pos <= p->Size) {
    if (p->Ptr == (uint8_t *)0x0) {
      __assert_fail("p->Ptr!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/memstream.c"
                    ,0x30,"err_t MemWrite(memstream *, const void *, size_t, size_t *)");
    }
    memcpy(p->Ptr + p->Pos,Data,Size);
    p->Pos = p->Pos + Size;
    *Written = Size;
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

static err_t MemWrite(memstream* p, const void* Data, size_t Size, size_t* Written)
{
    *Written = 0;
    if (Size + p->Pos > p->Size)
        return ERR_INVALID_PARAM;
    assert(p->Ptr!=NULL);
    memcpy((uint8_t*)p->Ptr + p->Pos, Data, Size);
    p->Pos += Size;
    *Written = Size;
    return ERR_NONE;
}